

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_csr.c
# Opt level: O2

int mbedtls_x509_csr_parse(mbedtls_x509_csr *csr,uchar *buf,size_t buflen)

{
  int iVar1;
  mbedtls_pem_context pem;
  size_t use_len;
  mbedtls_pem_context local_40;
  size_t local_28;
  
  iVar1 = -0x2800;
  if (buflen != 0 && (buf != (uchar *)0x0 && csr != (mbedtls_x509_csr *)0x0)) {
    mbedtls_pem_init(&local_40);
    if ((buf[buflen - 1] == '\0') &&
       (iVar1 = mbedtls_pem_read_buffer
                          (&local_40,"-----BEGIN CERTIFICATE REQUEST-----",
                           "-----END CERTIFICATE REQUEST-----",buf,(uchar *)0x0,0,&local_28),
       iVar1 != -0x1080)) {
      if (iVar1 != 0) {
        mbedtls_pem_free(&local_40);
        return iVar1;
      }
      iVar1 = mbedtls_x509_csr_parse_der(csr,local_40.buf,local_40.buflen);
      if (iVar1 != 0) {
        return iVar1;
      }
      mbedtls_pem_free(&local_40);
      return 0;
    }
    iVar1 = mbedtls_x509_csr_parse_der(csr,buf,buflen);
  }
  return iVar1;
}

Assistant:

int mbedtls_x509_csr_parse( mbedtls_x509_csr *csr, const unsigned char *buf, size_t buflen )
{
#if defined(MBEDTLS_PEM_PARSE_C)
    int ret;
    size_t use_len;
    mbedtls_pem_context pem;
#endif

    /*
     * Check for valid input
     */
    if( csr == NULL || buf == NULL || buflen == 0 )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_init( &pem );

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( buf[buflen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN CERTIFICATE REQUEST-----",
                               "-----END CERTIFICATE REQUEST-----",
                               buf, NULL, 0, &use_len );

    if( ret == 0 )
    {
        /*
         * Was PEM encoded, parse the result
         */
        if( ( ret = mbedtls_x509_csr_parse_der( csr, pem.buf, pem.buflen ) ) != 0 )
            return( ret );

        mbedtls_pem_free( &pem );
        return( 0 );
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
    {
        mbedtls_pem_free( &pem );
        return( ret );
    }
    else
#endif /* MBEDTLS_PEM_PARSE_C */
    return( mbedtls_x509_csr_parse_der( csr, buf, buflen ) );
}